

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O3

void __thiscall wasm::StackIROptimizer::dce(StackIROptimizer *this)

{
  StackInst *pSVar1;
  bool bVar2;
  StackIR *pSVar3;
  pointer ppSVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  pSVar3 = this->insts;
  ppSVar4 = (pSVar3->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((pSVar3->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar4) {
    bVar7 = false;
    uVar5 = 0;
    uVar6 = 1;
    do {
      pSVar1 = ppSVar4[uVar5];
      if (pSVar1 != (StackInst *)0x0) {
        if (bVar7) {
          if ((pSVar1->op < (TryEnd|BlockBegin)) && ((0x1eb4U >> (pSVar1->op & 0x1f) & 1) != 0)) {
            bVar7 = false;
          }
          else {
            removeAt(this,(int)uVar6 - 1);
            pSVar3 = this->insts;
            ppSVar4 = (pSVar3->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            bVar7 = true;
          }
        }
        else {
          bVar7 = (pSVar1->type).id == 1;
        }
      }
      bVar2 = uVar6 < (ulong)((long)(pSVar3->
                                    super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3
                             );
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void dce() {
    bool inUnreachableCode = false;
    for (Index i = 0; i < insts.size(); i++) {
      auto* inst = insts[i];
      if (!inst) {
        continue;
      }
      if (inUnreachableCode) {
        // Does the unreachable code end here?
        if (isControlFlowBarrier(inst)) {
          inUnreachableCode = false;
        } else {
          // We can remove this.
          removeAt(i);
        }
      } else if (inst->type == Type::unreachable) {
        inUnreachableCode = true;
      }
    }
  }